

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_move_32_pd_di(void)

{
  int iVar1;
  uint uVar2;
  uint addr_in;
  ulong uVar3;
  uint addr_in_00;
  
  uVar2 = OPER_AY_DI_32();
  uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  iVar1 = *(int *)((long)m68ki_cpu.dar + uVar3 + 0x20);
  addr_in = iVar1 - 4;
  *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20) = addr_in;
  addr_in_00 = iVar1 - 2;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in_00 = pmmu_translate_addr(addr_in_00);
  }
  m68k_write_memory_16(addr_in_00 & m68ki_cpu.address_mask,uVar2 & 0xffff);
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_16(addr_in & m68ki_cpu.address_mask,uVar2 >> 0x10);
  m68ki_cpu.n_flag = uVar2 >> 0x18;
  m68ki_cpu.not_z_flag = uVar2;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_32_pd_di(void)
{
	uint res = OPER_AY_DI_32();
	uint ea = EA_AX_PD_32();

	m68ki_write_16(ea+2, res & 0xFFFF );
	m68ki_write_16(ea, (res >> 16) & 0xFFFF );

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}